

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O0

void __thiscall
spdlog::details::thread_pool::post_flush
          (thread_pool *this,async_logger_ptr *worker_ptr,async_overflow_policy overflow_policy)

{
  async_msg *in_RDI;
  async_msg *new_msg;
  async_msg *in_stack_fffffffffffffe40;
  async_msg local_1b0;
  
  new_msg = &local_1b0;
  async_msg::async_msg
            (in_stack_fffffffffffffe40,(async_logger_ptr *)new_msg,
             (async_msg_type)((ulong)in_RDI >> 0x20));
  post_async_msg_((thread_pool *)in_stack_fffffffffffffe40,new_msg,
                  (async_overflow_policy)((ulong)in_RDI >> 0x20));
  async_msg::~async_msg(in_RDI);
  return;
}

Assistant:

void SPDLOG_INLINE thread_pool::post_flush(async_logger_ptr &&worker_ptr, async_overflow_policy overflow_policy)
{
    post_async_msg_(async_msg(std::move(worker_ptr), async_msg_type::flush), overflow_policy);
}